

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEEE754PluginTest.cpp
# Opt level: O1

void __thiscall
TEST_FE_with_Plugin_should_not_fail_again_when_test_has_already_failed_Test::
TEST_FE_with_Plugin_should_not_fail_again_when_test_has_already_failed_Test
          (TEST_FE_with_Plugin_should_not_fail_again_when_test_has_already_failed_Test *this)

{
  SimpleString SStack_28;
  
  (this->super_TEST_GROUP_CppUTestGroupFE_with_Plugin).ieee754Plugin.super_TestPlugin.name_.
  bufferSize_ = 0;
  *(undefined8 *)
   &(this->super_TEST_GROUP_CppUTestGroupFE_with_Plugin).ieee754Plugin.super_TestPlugin.enabled_ = 0
  ;
  (this->super_TEST_GROUP_CppUTestGroupFE_with_Plugin).ieee754Plugin.super_TestPlugin.next_ =
       (TestPlugin *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupFE_with_Plugin).ieee754Plugin.super_TestPlugin.name_.buffer_
       = (char *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupFE_with_Plugin).fixture.result_ = (TestResult *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupFE_with_Plugin).ieee754Plugin.super_TestPlugin.
  _vptr_TestPlugin = (_func_int **)0x0;
  *(undefined8 *)&(this->super_TEST_GROUP_CppUTestGroupFE_with_Plugin).fixture.ownsExecFunction_ = 0
  ;
  (this->super_TEST_GROUP_CppUTestGroupFE_with_Plugin).fixture.output_ =
       (StringBufferTestOutput *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupFE_with_Plugin).fixture.registry_ = (TestRegistry *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupFE_with_Plugin).fixture.genTest_ =
       (ExecFunctionTestShell *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupFE_with_Plugin).super_Utest._vptr_Utest = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupFE_with_Plugin).fixture._vptr_TestTestingFixture =
       (_func_int **)0x0;
  Utest::Utest((Utest *)this);
  (this->super_TEST_GROUP_CppUTestGroupFE_with_Plugin).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupFE_with_Plugin_002e16d0;
  TestTestingFixture::TestTestingFixture
            (&(this->super_TEST_GROUP_CppUTestGroupFE_with_Plugin).fixture);
  SimpleString::SimpleString(&SStack_28,"IEEE754ExceptionsPlugin");
  IEEE754ExceptionsPlugin::IEEE754ExceptionsPlugin
            (&(this->super_TEST_GROUP_CppUTestGroupFE_with_Plugin).ieee754Plugin,&SStack_28);
  SimpleString::~SimpleString(&SStack_28);
  (this->super_TEST_GROUP_CppUTestGroupFE_with_Plugin).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupFE_with_Plugin_002e1478;
  return;
}

Assistant:

TEST(FE_with_Plugin, should_not_fail_again_when_test_has_already_failed)
{
    fixture.setTestFunction(set_everything_but_already_failed);
    fixture.runAllTests();
    CHECK(IEEE754ExceptionsPlugin::checkIeee754OverflowExceptionFlag());
    CHECK(IEEE754ExceptionsPlugin::checkIeee754UnderflowExceptionFlag());
    CHECK(IEEE754ExceptionsPlugin::checkIeee754InexactExceptionFlag());
    CHECK(IEEE754ExceptionsPlugin::checkIeee754DivByZeroExceptionFlag());
    LONGS_EQUAL(1, fixture.getCheckCount());
    LONGS_EQUAL(1, fixture.getFailureCount());
}